

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack1_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  auVar5 = vpmovsxbd_avx512f(_DAT_00187950);
  auVar6 = vpmovsxbd_avx512f(_DAT_00187960);
  auVar4 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_00190d20);
  auVar1 = vpsrlvd_avx2(auVar4._0_16_,_DAT_00193ec0);
  auVar2 = vpsrlvd_avx2(auVar4._0_16_,_DAT_00193ed0);
  auVar5 = vpermi2d_avx512f(auVar5,ZEXT3264(auVar3),ZEXT3264(auVar4));
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar5 = vpermi2d_avx512f(auVar6,auVar5,ZEXT1664(auVar1));
  auVar6 = vpbroadcastd_avx512f();
  auVar8._0_52_ = auVar5._0_52_;
  auVar8._52_4_ = auVar6._52_4_;
  auVar8._56_4_ = auVar5._56_4_;
  auVar8._60_4_ = auVar5._60_4_;
  auVar6 = vpermi2q_avx512f(auVar7,auVar8,ZEXT1664(auVar2));
  auVar5._8_4_ = 1;
  auVar5._0_8_ = 0x100000001;
  auVar5._12_4_ = 1;
  auVar5._16_4_ = 1;
  auVar5._20_4_ = 1;
  auVar5._24_4_ = 1;
  auVar5._28_4_ = 1;
  auVar5._32_4_ = 1;
  auVar5._36_4_ = 1;
  auVar5._40_4_ = 1;
  auVar5._44_4_ = 1;
  auVar5._48_4_ = 1;
  auVar5._52_4_ = 1;
  auVar5._56_4_ = 1;
  auVar5._60_4_ = 1;
  auVar5 = vpandd_avx512f(auVar6,auVar5);
  auVar5 = vmovdqu64_avx512f(auVar5);
  *(undefined1 (*) [64])out = auVar5;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack1_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) & 1;
  out++;
  *out = ((*in) >> 1) & 1;
  out++;
  *out = ((*in) >> 2) & 1;
  out++;
  *out = ((*in) >> 3) & 1;
  out++;
  *out = ((*in) >> 4) & 1;
  out++;
  *out = ((*in) >> 5) & 1;
  out++;
  *out = ((*in) >> 6) & 1;
  out++;
  *out = ((*in) >> 7) & 1;
  out++;
  *out = ((*in) >> 8) & 1;
  out++;
  *out = ((*in) >> 9) & 1;
  out++;
  *out = ((*in) >> 10) & 1;
  out++;
  *out = ((*in) >> 11) & 1;
  out++;
  *out = ((*in) >> 12) & 1;
  out++;
  *out = ((*in) >> 13) & 1;
  out++;
  *out = ((*in) >> 14) & 1;
  out++;
  *out = ((*in) >> 15) & 1;
  out++;

  return in + 1;
}